

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O0

void fs_add_serializer_metainfo_d(void *serializer,char *name,int name_length,double value)

{
  allocator local_49;
  string local_48;
  double local_28;
  double value_local;
  char *pcStack_18;
  int name_length_local;
  char *name_local;
  void *serializer_local;
  
  local_28 = value;
  value_local._4_4_ = name_length;
  pcStack_18 = name;
  name_local = (char *)serializer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,name,(long)name_length,&local_49);
  ser::Serializer::AddMetainfo<double>((Serializer *)serializer,&local_48,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

void fs_add_serializer_metainfo_d(void* serializer, const char* name, int name_length, double value)
{
    reinterpret_cast<Serializer*>(serializer)->AddMetainfo(std::string(name, name_length), value);
}